

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

bool __thiscall QMYSQLResult::fetch(QMYSQLResult *this,int i)

{
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QSqlError local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar5 = QSqlResult::driver();
  if (lVar5 == 0) {
LAB_0010976a:
    bVar6 = false;
  }
  else {
    cVar2 = QSqlResult::isForwardOnly();
    iVar4 = QSqlResult::at();
    if (cVar2 != '\0') {
      if (iVar4 < i) {
        iVar4 = QSqlResult::at();
        iVar4 = iVar4 - i;
        do {
          iVar4 = iVar4 + 1;
          if (iVar4 == 0) break;
          cVar2 = (**(code **)(*(long *)this + 0x90))(this);
        } while (cVar2 != '\0');
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          uVar3 = (**(code **)(*(long *)this + 0x90))(this);
          return (bool)uVar3;
        }
        goto LAB_0010978d;
      }
      goto LAB_0010976a;
    }
    bVar6 = true;
    if (iVar4 != i) {
      if (*(char *)(lVar1 + 0xfd) == '\x01') {
        mysql_stmt_data_seek(*(undefined8 *)(lVar1 + 0xd8));
        iVar4 = mysql_stmt_fetch(*(undefined8 *)(lVar1 + 0xd8));
        if (iVar4 != 0) {
          if ((iVar4 != 0x65) && (iVar4 != 1)) goto LAB_0010976a;
          bVar6 = false;
          QCoreApplication::translate((char *)&local_50,"QMYSQLResult","Unable to fetch data",0);
          qMakeStmtError((QString *)local_38,(ErrorType)&local_50,*(MYSQL_STMT **)(lVar1 + 0xd8));
          (**(code **)(*(long *)this + 0x28))(this,local_38);
          QSqlError::~QSqlError(local_38);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          goto LAB_0010976d;
        }
      }
      else {
        mysql_data_seek(*(undefined8 *)(lVar1 + 0xb0),(long)i);
        lVar5 = mysql_fetch_row(*(undefined8 *)(lVar1 + 0xb0));
        *(long *)(lVar1 + 0xb8) = lVar5;
        if (lVar5 == 0) goto LAB_0010976a;
      }
      (**(code **)(*(long *)this + 0x18))(this,i);
    }
  }
LAB_0010976d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
LAB_0010978d:
  __stack_chk_fail();
}

Assistant:

bool QMYSQLResult::fetch(int i)
{
    Q_D(QMYSQLResult);
    if (!driver())
        return false;
    if (isForwardOnly()) { // fake a forward seek
        if (at() < i) {
            int x = i - at();
            while (--x && fetchNext()) {};
            return fetchNext();
        } else {
            return false;
        }
    }
    if (at() == i)
        return true;
    if (d->preparedQuery) {
        mysql_stmt_data_seek(d->stmt, i);

        int nRC = mysql_stmt_fetch(d->stmt);
        if (nRC) {
            if (nRC == 1 || nRC == MYSQL_DATA_TRUNCATED)
                setLastError(qMakeStmtError(QCoreApplication::translate("QMYSQLResult",
                         "Unable to fetch data"), QSqlError::StatementError, d->stmt));
            return false;
        }
    } else {
        mysql_data_seek(d->result, i);
        d->row = mysql_fetch_row(d->result);
        if (!d->row)
            return false;
    }

    setAt(i);
    return true;
}